

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

bool __thiscall QMakeEvaluator::loadSpec(QMakeEvaluator *this)

{
  bool bVar1;
  VisitReturn VVar2;
  ProStringList *pPVar3;
  ProString *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_QLatin1Char> QVar4;
  QByteArrayView QVar5;
  QString *root;
  add_const_t<QList<QString>_> *__range2;
  VfsFlags flags;
  QString mkspec;
  const_iterator __end2;
  const_iterator __begin2;
  QString qmakespec;
  QMakeEvaluator evaluator;
  undefined4 in_stack_fffffffffffff7c8;
  VfsFlag in_stack_fffffffffffff7cc;
  QMakeEvaluator *in_stack_fffffffffffff7d0;
  QMakeVfs *in_stack_fffffffffffff7d8;
  QMakeEvaluator *in_stack_fffffffffffff7e0;
  int fieldWidth;
  QFlagsStorage<QMakeVfs::VfsFlag> flags_00;
  QMakeEvaluator *in_stack_fffffffffffff7e8;
  QMakeGlobals *in_stack_fffffffffffff7f0;
  QMakeEvaluator *in_stack_fffffffffffff7f8;
  QMakeParser *in_stack_fffffffffffff800;
  QMakeGlobals *in_stack_fffffffffffff808;
  undefined4 in_stack_fffffffffffff810;
  EvalFileType in_stack_fffffffffffff814;
  QString *in_stack_fffffffffffff818;
  QChar fillChar;
  QMakeEvaluator *in_stack_fffffffffffff820;
  QMakeEvaluator *this_01;
  EvalFileType local_780;
  byte local_76d;
  QFlagsStorage<QMakeEvaluator::LoadFlag> in_stack_fffffffffffff8bc;
  undefined1 local_5d0 [30];
  QChar local_5b2;
  storage_type *local_5b0;
  undefined1 local_5a0 [48];
  QString *local_570;
  char local_568;
  QLatin1Char local_559;
  undefined8 local_558;
  undefined8 uStack_550;
  QString *local_548;
  QString *local_538;
  const_iterator local_530;
  const_iterator local_528 [70];
  QString local_2f8;
  QString *local_2e0;
  char local_2d8;
  undefined1 local_2b8 [296];
  QString QStack_190;
  QString aQStack_178 [15];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2f8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_2f8.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_2f8.d.size = -0x5555555555555556;
  this_01 = *(QMakeEvaluator **)(in_RDI + 0x290);
  QMakeGlobals::expandEnvVars(in_stack_fffffffffffff7f0,(QString *)in_stack_fffffffffffff7e8);
  memset(local_2b8,0xaa,0x2b0);
  QMakeEvaluator((QMakeEvaluator *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                 in_stack_fffffffffffff808,in_stack_fffffffffffff800,
                 (QMakeVfs *)in_stack_fffffffffffff7f8,(QMakeHandler *)in_stack_fffffffffffff7f0);
  QString::operator=(&QStack_190,(QString *)(in_RDI + 0x128));
  QString::operator=(aQStack_178,(QString *)(in_RDI + 0x140));
  bVar1 = QString::isEmpty((QString *)0x2f9bf4);
  local_780 = in_stack_fffffffffffff814;
  if (bVar1) {
LAB_002f9c59:
    bVar1 = QString::isEmpty((QString *)0x2f9c6d);
    if (!bVar1) {
      operator|((enum_type)((ulong)in_stack_fffffffffffff7d0 >> 0x20),
                (enum_type)in_stack_fffffffffffff7d0);
      VVar2 = evaluateFile(in_stack_fffffffffffff820,in_stack_fffffffffffff818,local_780,
                           (LoadFlags)in_stack_fffffffffffff8bc.i);
      if (VVar2 != ReturnTrue) {
        local_76d = 0;
        bVar1 = true;
        goto LAB_002f9faf;
      }
    }
    bVar1 = QString::isEmpty((QString *)0x2f9ce6);
    if (!bVar1) {
      operator|((enum_type)((ulong)in_stack_fffffffffffff7d0 >> 0x20),
                (enum_type)in_stack_fffffffffffff7d0);
      VVar2 = evaluateFile(in_stack_fffffffffffff820,in_stack_fffffffffffff818,local_780,
                           (LoadFlags)in_stack_fffffffffffff8bc.i);
      if (VVar2 != ReturnTrue) {
        local_76d = 0;
        bVar1 = true;
        goto LAB_002f9faf;
      }
    }
    bVar1 = QString::isEmpty((QString *)0x2f9d58);
    if (bVar1) {
      if ((*(byte *)(in_RDI + 0x91) & 1) == 0) {
        ProKey::ProKey((ProKey *)in_stack_fffffffffffff7d0,
                       (char *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        first(in_stack_fffffffffffff7e8,(ProKey *)in_stack_fffffffffffff7e0);
        ProString::toQString
                  ((ProString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        QString::operator=((QString *)in_stack_fffffffffffff7d0,
                           (QString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8))
        ;
        QString::~QString((QString *)0x2f9dde);
        ProString::~ProString((ProString *)0x2f9deb);
        ProKey::~ProKey((ProKey *)0x2f9df8);
      }
      bVar1 = QString::isEmpty((QString *)0x2f9e05);
      if (bVar1) {
        ProKey::ProKey((ProKey *)in_stack_fffffffffffff7d0,
                       (char *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        first(in_stack_fffffffffffff7e8,(ProKey *)in_stack_fffffffffffff7e0);
        ProString::toQString
                  ((ProString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        QString::operator=((QString *)in_stack_fffffffffffff7d0,
                           (QString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8))
        ;
        QString::~QString((QString *)0x2f9e76);
        ProString::~ProString((ProString *)0x2f9e83);
        ProKey::~ProKey((ProKey *)0x2f9e90);
      }
    }
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff7d0,
                   (char *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
    values(in_stack_fffffffffffff7f8,(ProKey *)in_stack_fffffffffffff7f0);
    ProStringList::toQStringList((ProStringList *)in_stack_fffffffffffff7f0);
    QList<QString>::operator=
              ((QList<QString> *)in_stack_fffffffffffff7d0,
               (QList<QString> *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
    QList<QString>::~QList((QList<QString> *)0x2f9f01);
    ProStringList::~ProStringList((ProStringList *)0x2f9f0e);
    ProKey::~ProKey((ProKey *)0x2f9f1b);
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff7d0,
                   (char *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
    values(in_stack_fffffffffffff7f8,(ProKey *)in_stack_fffffffffffff7f0);
    ProStringList::toQStringList((ProStringList *)in_stack_fffffffffffff7f0);
    QList<QString>::operator=
              ((QList<QString> *)in_stack_fffffffffffff7d0,
               (QList<QString> *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
    QList<QString>::~QList((QList<QString> *)0x2f9f8a);
    ProStringList::~ProStringList((ProStringList *)0x2f9f97);
    ProKey::~ProKey((ProKey *)0x2f9fa4);
    bVar1 = false;
  }
  else {
    operator|((enum_type)((ulong)in_stack_fffffffffffff7d0 >> 0x20),
              (enum_type)in_stack_fffffffffffff7d0);
    VVar2 = evaluateFile(in_stack_fffffffffffff820,in_stack_fffffffffffff818,
                         in_stack_fffffffffffff814,(LoadFlags)in_stack_fffffffffffff8bc.i);
    local_780 = in_stack_fffffffffffff814;
    if (VVar2 == ReturnTrue) goto LAB_002f9c59;
    local_76d = 0;
    bVar1 = true;
  }
LAB_002f9faf:
  ~QMakeEvaluator(in_stack_fffffffffffff7e0);
  if (!bVar1) {
    updateMkspecPaths(this_01);
    bVar1 = QString::isEmpty((QString *)0x2f9fe7);
    if (bVar1) {
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff7d0,
                     (char *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
      propertyValue(in_stack_fffffffffffff7f8,(ProKey *)in_stack_fffffffffffff7f0);
      ProString::toQString
                ((ProString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
      QString::operator=((QString *)in_stack_fffffffffffff7d0,
                         (QString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
      QString::~QString((QString *)0x2fa074);
      ProString::~ProString((ProString *)0x2fa081);
      ProKey::~ProKey((ProKey *)0x2fa08e);
    }
    bVar1 = QMakeInternal::IoUtils::isRelativePath((QString *)in_stack_fffffffffffff7d0);
    if (bVar1) {
      local_528[0].i = (QString *)0xaaaaaaaaaaaaaaaa;
      local_528[0] = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffff7d0);
      local_530.i = (QString *)0xaaaaaaaaaaaaaaaa;
      local_530 = QList<QString>::end((QList<QString> *)in_stack_fffffffffffff7d0);
      while( true ) {
        fillChar.ucs = (char16_t)((ulong)in_stack_fffffffffffff818 >> 0x30);
        local_538 = local_530.i;
        bVar1 = QList<QString>::const_iterator::operator!=(local_528,local_530);
        if (!bVar1) break;
        in_stack_fffffffffffff818 = (QString *)0xaaaaaaaaaaaaaaaa;
        in_stack_fffffffffffff820 =
             (QMakeEvaluator *)QList<QString>::const_iterator::operator*(local_528);
        local_558 = 0xaaaaaaaaaaaaaaaa;
        uStack_550 = 0xaaaaaaaaaaaaaaaa;
        local_548 = in_stack_fffffffffffff818;
        QLatin1Char::QLatin1Char(&local_559,'/');
        QVar4 = ::operator+((QString *)in_stack_fffffffffffff7d8,
                            (QLatin1Char *)in_stack_fffffffffffff7d0);
        local_570 = QVar4.a;
        local_568 = (char)QVar4.b.ch;
        local_2e0 = local_570;
        local_2d8 = local_568;
        ::operator+((QStringBuilder<const_QString_&,_QLatin1Char> *)in_stack_fffffffffffff7d0,
                    (QString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QStringBuilder<const_QString_&,_QLatin1Char>,_QString_&> *)
                   CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        bVar1 = QMakeInternal::IoUtils::exists((QString *)0x2fa22c);
        if (bVar1) {
          QString::operator=(&local_2f8,(QString *)&local_558);
          local_780 = EvalAuxFile;
        }
        else {
          local_780 = EvalProjectFile;
        }
        QString::~QString((QString *)0x2fa26c);
        if (local_780 != EvalProjectFile) {
          if (local_780 == EvalAuxFile) goto LAB_002fa357;
          goto LAB_002fa7eb;
        }
        QList<QString>::const_iterator::operator++(local_528);
      }
      QByteArrayView::QByteArrayView<32ul>
                ((QByteArrayView *)in_stack_fffffffffffff7e0,
                 (char (*) [32])in_stack_fffffffffffff7d8);
      fieldWidth = (int)((ulong)in_stack_fffffffffffff7e0 >> 0x20);
      QVar5.m_data = local_5b0;
      QVar5.m_size = (qsizetype)local_5a0;
      QString::fromLatin1(QVar5);
      QChar::QChar<char16_t,_true>(&local_5b2,L' ');
      QString::arg<QString,_true>
                ((QString *)in_stack_fffffffffffff7f0,(QString *)in_stack_fffffffffffff7e8,
                 fieldWidth,fillChar);
      evalError(in_stack_fffffffffffff7d0,
                (QString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
      QString::~QString((QString *)0x2fa330);
      QString::~QString((QString *)0x2fa33d);
      local_76d = 0;
    }
    else {
LAB_002fa357:
      QDir::cleanPath((QString *)local_5d0);
      QString::operator=((QString *)in_stack_fffffffffffff7d0,
                         (QString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
      QString::~QString((QString *)0x2fa395);
      bVar1 = QString::isEmpty((QString *)0x2fa3a9);
      if (!bVar1) {
        ProKey::ProKey((ProKey *)in_stack_fffffffffffff7d0,
                       (char *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        valuesRef(in_stack_fffffffffffff7f8,(ProKey *)in_stack_fffffffffffff7f0);
        ProString::ProString
                  ((ProString *)in_stack_fffffffffffff7d0,
                   (QString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        ProStringList::operator<<
                  ((ProStringList *)in_stack_fffffffffffff7d0,
                   (ProString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        ProString::~ProString((ProString *)0x2fa41a);
        ProKey::~ProKey((ProKey *)0x2fa427);
        operator|((enum_type)((ulong)in_stack_fffffffffffff7d0 >> 0x20),
                  (enum_type)in_stack_fffffffffffff7d0);
        VVar2 = evaluateFile(in_stack_fffffffffffff820,in_stack_fffffffffffff818,local_780,
                             (LoadFlags)in_stack_fffffffffffff8bc.i);
        if (VVar2 != ReturnTrue) {
          local_76d = 0;
          goto LAB_002fa7eb;
        }
      }
      bVar1 = loadSpecInternal(in_stack_fffffffffffff7e0);
      flags_00.i = (Int)((ulong)in_stack_fffffffffffff7e0 >> 0x20);
      if (bVar1) {
        bVar1 = QString::isEmpty((QString *)0x2fa4c7);
        if (!bVar1) {
          ProKey::ProKey((ProKey *)in_stack_fffffffffffff7d0,
                         (char *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
          in_stack_fffffffffffff7f0 =
               (QMakeGlobals *)
               valuesRef(in_stack_fffffffffffff7f8,(ProKey *)in_stack_fffffffffffff7f0);
          ProString::ProString
                    ((ProString *)in_stack_fffffffffffff7d0,
                     (QString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
          ProStringList::operator<<
                    ((ProStringList *)in_stack_fffffffffffff7d0,
                     (ProString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
          ProString::~ProString((ProString *)0x2fa538);
          ProKey::~ProKey((ProKey *)0x2fa545);
          in_stack_fffffffffffff7f8 = (QMakeEvaluator *)(in_RDI + 0xe0);
          QFlags<QMakeEvaluator::LoadFlag>::QFlags
                    ((QFlags<QMakeEvaluator::LoadFlag> *)in_stack_fffffffffffff7d0,
                     in_stack_fffffffffffff7cc);
          VVar2 = evaluateFile(in_stack_fffffffffffff820,in_stack_fffffffffffff818,local_780,
                               (LoadFlags)in_stack_fffffffffffff8bc.i);
          if (VVar2 != ReturnTrue) {
            local_76d = 0;
            goto LAB_002fa7eb;
          }
        }
        bVar1 = QString::isEmpty((QString *)0x2fa5b8);
        if (!bVar1) {
          ProKey::ProKey((ProKey *)in_stack_fffffffffffff7d0,
                         (char *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
          pPVar3 = valuesRef(in_stack_fffffffffffff7f8,(ProKey *)in_stack_fffffffffffff7f0);
          flags_00.i = (Int)((ulong)pPVar3 >> 0x20);
          ProString::ProString
                    ((ProString *)in_stack_fffffffffffff7d0,
                     (QString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
          ProStringList::operator<<
                    ((ProStringList *)in_stack_fffffffffffff7d0,
                     (ProString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
          ProString::~ProString((ProString *)0x2fa629);
          ProKey::~ProKey((ProKey *)0x2fa636);
          QFlags<QMakeEvaluator::LoadFlag>::QFlags
                    ((QFlags<QMakeEvaluator::LoadFlag> *)in_stack_fffffffffffff7d0,
                     in_stack_fffffffffffff7cc);
          VVar2 = evaluateFile(in_stack_fffffffffffff820,in_stack_fffffffffffff818,local_780,
                               (LoadFlags)in_stack_fffffffffffff8bc.i);
          if (VVar2 != ReturnTrue) {
            local_76d = 0;
            goto LAB_002fa7eb;
          }
        }
        QFlags<QMakeVfs::VfsFlag>::QFlags
                  ((QFlags<QMakeVfs::VfsFlag> *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc)
        ;
        bVar1 = QString::isEmpty((QString *)0x2fa6c5);
        if ((!bVar1) &&
           (bVar1 = QMakeVfs::exists(in_stack_fffffffffffff7d8,(QString *)in_stack_fffffffffffff7d0,
                                     (VfsFlags)flags_00.i), bVar1)) {
          ProKey::ProKey((ProKey *)in_stack_fffffffffffff7d0,
                         (char *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
          this_00 = (ProString *)
                    valuesRef(in_stack_fffffffffffff7f8,(ProKey *)in_stack_fffffffffffff7f0);
          ProString::ProString
                    (this_00,(QString *)
                             CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
          ProStringList::operator<<
                    ((ProStringList *)this_00,
                     (ProString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
          ProString::~ProString((ProString *)0x2fa76f);
          ProKey::~ProKey((ProKey *)0x2fa77c);
          QFlags<QMakeEvaluator::LoadFlag>::QFlags
                    ((QFlags<QMakeEvaluator::LoadFlag> *)this_00,in_stack_fffffffffffff7cc);
          VVar2 = evaluateFile(in_stack_fffffffffffff820,in_stack_fffffffffffff818,local_780,
                               (LoadFlags)in_stack_fffffffffffff8bc.i);
          if (VVar2 != ReturnTrue) {
            local_76d = 0;
            goto LAB_002fa7eb;
          }
        }
        local_76d = 1;
      }
      else {
        local_76d = 0;
      }
    }
  }
LAB_002fa7eb:
  QString::~QString((QString *)0x2fa7f8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_76d & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QMakeEvaluator::loadSpec()
{
    QString qmakespec = m_option->expandEnvVars(
                m_hostBuild ? m_option->qmakespec : m_option->xqmakespec);

    {
        QMakeEvaluator evaluator(m_option, m_parser, m_vfs, m_handler);
        evaluator.m_sourceRoot = m_sourceRoot;
        evaluator.m_buildRoot = m_buildRoot;

        if (!m_superfile.isEmpty() && evaluator.evaluateFile(
                m_superfile, QMakeHandler::EvalConfigFile, LoadProOnly|LoadHidden) != ReturnTrue) {
            return false;
        }
        if (!m_conffile.isEmpty() && evaluator.evaluateFile(
                m_conffile, QMakeHandler::EvalConfigFile, LoadProOnly|LoadHidden) != ReturnTrue) {
            return false;
        }
        if (!m_cachefile.isEmpty() && evaluator.evaluateFile(
                m_cachefile, QMakeHandler::EvalConfigFile, LoadProOnly|LoadHidden) != ReturnTrue) {
            return false;
        }
        if (qmakespec.isEmpty()) {
            if (!m_hostBuild)
                qmakespec = evaluator.first(ProKey("XQMAKESPEC")).toQString();
            if (qmakespec.isEmpty())
                qmakespec = evaluator.first(ProKey("QMAKESPEC")).toQString();
        }
        m_qmakepath = evaluator.values(ProKey("QMAKEPATH")).toQStringList();
        m_qmakefeatures = evaluator.values(ProKey("QMAKEFEATURES")).toQStringList();
    }

    updateMkspecPaths();
    if (qmakespec.isEmpty())
        qmakespec = propertyValue(ProKey(m_hostBuild ? "QMAKE_SPEC" : "QMAKE_XSPEC")).toQString();
#ifndef QT_BUILD_QMAKE
    // Legacy support for Qt4 qmake in Qt Creator, etc.
    if (qmakespec.isEmpty())
        qmakespec = m_hostBuild ? QLatin1String("default-host") : QLatin1String("default");
#endif
    if (IoUtils::isRelativePath(qmakespec)) {
        for (const QString &root : std::as_const(m_mkspecPaths)) {
            QString mkspec = root + QLatin1Char('/') + qmakespec;
            if (IoUtils::exists(mkspec)) {
                qmakespec = mkspec;
                goto cool;
            }
        }
        evalError(fL1S("Could not find qmake spec '%1'.").arg(qmakespec));
        return false;
    }
  cool:
    m_qmakespec = QDir::cleanPath(qmakespec);

    if (!m_superfile.isEmpty()) {
        valuesRef(ProKey("_QMAKE_SUPER_CACHE_")) << ProString(m_superfile);
        if (evaluateFile(
                m_superfile, QMakeHandler::EvalConfigFile, LoadProOnly|LoadHidden) != ReturnTrue)
            return false;
    }
    if (!loadSpecInternal())
        return false;
    if (!m_conffile.isEmpty()) {
        valuesRef(ProKey("_QMAKE_CONF_")) << ProString(m_conffile);
        if (evaluateFile(
                m_conffile, QMakeHandler::EvalConfigFile, LoadProOnly) != ReturnTrue)
            return false;
    }
    if (!m_cachefile.isEmpty()) {
        valuesRef(ProKey("_QMAKE_CACHE_")) << ProString(m_cachefile);
        if (evaluateFile(
                m_cachefile, QMakeHandler::EvalConfigFile, LoadProOnly) != ReturnTrue)
            return false;
    }
    QMakeVfs::VfsFlags flags = (m_cumulative ? QMakeVfs::VfsCumulative : QMakeVfs::VfsExact);
    if (!m_stashfile.isEmpty() && m_vfs->exists(m_stashfile, flags)) {
        valuesRef(ProKey("_QMAKE_STASH_")) << ProString(m_stashfile);
        if (evaluateFile(
                m_stashfile, QMakeHandler::EvalConfigFile, LoadProOnly) != ReturnTrue)
            return false;
    }
    return true;
}